

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_dalloc_bin_slab(tsdn_t *tsdn,arena_t *arena,extent_t *slab,bin_t *bin)

{
  size_t *psVar1;
  
  (bin->lock).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40));
  arena_slab_dalloc(tsdn,arena,slab);
  malloc_mutex_lock(tsdn,&bin->lock);
  psVar1 = &(bin->stats).curslabs;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

static void
arena_dalloc_bin_slab(tsdn_t *tsdn, arena_t *arena, extent_t *slab,
    bin_t *bin) {
	assert(slab != bin->slabcur);

	malloc_mutex_unlock(tsdn, &bin->lock);
	/******************************/
	arena_slab_dalloc(tsdn, arena, slab);
	/****************************/
	malloc_mutex_lock(tsdn, &bin->lock);
	if (config_stats) {
		bin->stats.curslabs--;
	}
}